

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListCopy(xmlListPtr cur,xmlListPtr old)

{
  int iVar1;
  _xmlLink *local_28;
  xmlLinkPtr lk;
  xmlListPtr old_local;
  xmlListPtr cur_local;
  
  if ((old == (xmlListPtr)0x0) || (cur == (xmlListPtr)0x0)) {
    cur_local._4_4_ = 1;
  }
  else {
    for (local_28 = old->sentinel->next; local_28 != old->sentinel; local_28 = local_28->next) {
      iVar1 = xmlListInsert(cur,local_28->data);
      if (iVar1 != 0) {
        xmlListDelete(cur);
        return 1;
      }
    }
    cur_local._4_4_ = 0;
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlListCopy(xmlListPtr cur, xmlListPtr old)
{
    /* Walk the old tree and insert the data into the new one */
    xmlLinkPtr lk;

    if ((old == NULL) || (cur == NULL))
        return(1);
    for(lk = old->sentinel->next; lk != old->sentinel; lk = lk->next) {
        if (0 !=xmlListInsert(cur, lk->data)) {
            xmlListDelete(cur);
            return (1);
        }
    }
    return (0);
}